

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::ConstraintException::ConstraintException<std::__cxx11::string,std::__cxx11::string>
          (ConstraintException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_58,(string *)params);
  ::std::__cxx11::string::string((string *)&bStack_78,(string *)params_1);
  Exception::ConstructMessage<std::__cxx11::string,std::__cxx11::string>
            (&local_38,(Exception *)msg,&local_58,&bStack_78,in_R8);
  ConstraintException(this,(string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&bStack_78);
  ::std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

explicit ConstraintException(const string &msg, ARGS... params)
	    : ConstraintException(ConstructMessage(msg, params...)) {
	}